

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O1

void __thiscall ON_ObjRef::ON_ObjRef(ON_ObjRef *this,ON_ObjRef *src)

{
  int *piVar1;
  undefined8 uVar2;
  double dVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  int iVar6;
  long lVar7;
  ON_ObjRefEvaluationParameter *pOVar8;
  ON_ObjRefEvaluationParameter *pOVar9;
  
  uVar4 = (src->m_uuid).Data2;
  uVar5 = (src->m_uuid).Data3;
  uVar2 = *(undefined8 *)(src->m_uuid).Data4;
  (this->m_uuid).Data1 = (src->m_uuid).Data1;
  (this->m_uuid).Data2 = uVar4;
  (this->m_uuid).Data3 = uVar5;
  *(undefined8 *)(this->m_uuid).Data4 = uVar2;
  this->m_geometry = src->m_geometry;
  this->m_parent_geometry = src->m_parent_geometry;
  this->m_component_index = src->m_component_index;
  this->m_geometry_type = src->m_geometry_type;
  this->m_runtime_sn = src->m_runtime_sn;
  dVar3 = (src->m_point).y;
  (this->m_point).x = (src->m_point).x;
  (this->m_point).y = dVar3;
  (this->m_point).z = (src->m_point).z;
  this->m_osnap_mode = src->m_osnap_mode;
  pOVar8 = &src->m_evp;
  pOVar9 = &this->m_evp;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    iVar6 = pOVar8->m_reserved;
    pOVar9->m_t_type = pOVar8->m_t_type;
    pOVar9->m_reserved = iVar6;
    pOVar8 = (ON_ObjRefEvaluationParameter *)pOVar8->m_t;
    pOVar9 = (ON_ObjRefEvaluationParameter *)pOVar9->m_t;
  }
  (this->m__iref)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00825e90;
  (this->m__iref).m_a = (ON_ObjRef_IRefID *)0x0;
  (this->m__iref).m_count = 0;
  (this->m__iref).m_capacity = 0;
  ON_SimpleArray<ON_ObjRef_IRefID>::operator=(&this->m__iref,&src->m__iref);
  this->m__proxy1 = src->m__proxy1;
  this->m__proxy2 = src->m__proxy2;
  piVar1 = src->m__proxy_ref_count;
  this->m__proxy_ref_count = piVar1;
  if ((piVar1 != (int *)0x0) && (0 < *piVar1)) {
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

ON_ObjRef::ON_ObjRef( const ON_ObjRef& src ) 
          : m_uuid(src.m_uuid),
            m_geometry(src.m_geometry),
            m_parent_geometry(src.m_parent_geometry),
            m_component_index(src.m_component_index),
            m_geometry_type(src.m_geometry_type),
            m_runtime_sn(src.m_runtime_sn),
            m_point(src.m_point),
            m_osnap_mode(src.m_osnap_mode),
            m_evp(src.m_evp),
            m__iref(src.m__iref),
            m__proxy1(src.m__proxy1),
            m__proxy2(src.m__proxy2),
            m__proxy_ref_count(src.m__proxy_ref_count)
{
  if ( m__proxy_ref_count && *m__proxy_ref_count > 0 )
  {
    *m__proxy_ref_count = *m__proxy_ref_count + 1;
  }
}